

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O1

void __thiscall cppnet::SingletonLogger::SingletonLogger(SingletonLogger *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  BaseLogger *pBVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  undefined1 local_29;
  BaseLogger *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_20 [2];
  
  (this->super_Singleton<cppnet::SingletonLogger>)._vptr_Singleton =
       (_func_int **)&PTR__SingletonLogger_00125938;
  (this->_logger).super___shared_ptr<cppnet::BaseLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->_logger).super___shared_ptr<cppnet::BaseLogger,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_28 = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<cppnet::BaseLogger,std::allocator<cppnet::BaseLogger>,unsigned_short_const&,unsigned_short_const&>
            (a_Stack_20,&local_28,(allocator<cppnet::BaseLogger> *)&local_29,&__log_cache_size,
             &__log_block_size);
  _Var2._M_pi = a_Stack_20[0]._M_pi;
  pBVar1 = local_28;
  local_28 = (BaseLogger *)0x0;
  a_Stack_20[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (this->_logger).super___shared_ptr<cppnet::BaseLogger,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->_logger).super___shared_ptr<cppnet::BaseLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr = pBVar1
  ;
  (this->_logger).super___shared_ptr<cppnet::BaseLogger,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var2._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (a_Stack_20[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_20[0]._M_pi);
  }
  return;
}

Assistant:

SingletonLogger::SingletonLogger() {
    _logger = std::make_shared<BaseLogger>(__log_cache_size, __log_block_size);
}